

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O0

void foreach_bit(bit_vec v,bv_func func,void *p1,void *p2)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  code *in_RSI;
  short *in_RDI;
  uchar nibble;
  int j;
  int i;
  int local_28;
  int local_24;
  
  for (local_24 = 0; local_24 < *in_RDI; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
      switch((byte)((int)*(char *)((long)in_RDI + (long)local_24 + 2) >> (((byte)local_28 & 7) << 2)
                   ) & 0xf) {
      case 0:
        break;
      case 1:
        (*in_RSI)(local_24 * 8 + local_28 * 4,in_RDX,in_RCX);
        break;
      case 2:
        (*in_RSI)(local_24 * 8 + local_28 * 4 + 1,in_RDX,in_RCX);
        break;
      case 3:
        (*in_RSI)(local_24 * 8 + local_28 * 4 + 1,in_RDX,in_RCX);
        (*in_RSI)(local_24 * 8 + local_28 * 4,in_RDX,in_RCX);
        break;
      case 4:
        (*in_RSI)(local_24 * 8 + local_28 * 4 + 2,in_RDX,in_RCX);
        break;
      case 5:
        (*in_RSI)(local_24 * 8 + local_28 * 4 + 2,in_RDX,in_RCX);
        (*in_RSI)(local_24 * 8 + local_28 * 4,in_RDX,in_RCX);
        break;
      case 6:
        (*in_RSI)(local_24 * 8 + local_28 * 4 + 2,in_RDX,in_RCX);
        (*in_RSI)(local_24 * 8 + local_28 * 4 + 1,in_RDX,in_RCX);
        break;
      case 7:
        (*in_RSI)(local_24 * 8 + local_28 * 4 + 2,in_RDX,in_RCX);
        (*in_RSI)(local_24 * 8 + local_28 * 4 + 1,in_RDX,in_RCX);
        (*in_RSI)(local_24 * 8 + local_28 * 4,in_RDX,in_RCX);
        break;
      case 8:
        (*in_RSI)(local_24 * 8 + local_28 * 4 + 3,in_RDX,in_RCX);
        break;
      case 9:
        (*in_RSI)(local_24 * 8 + local_28 * 4 + 3,in_RDX,in_RCX);
        (*in_RSI)(local_24 * 8 + local_28 * 4,in_RDX,in_RCX);
        break;
      case 10:
        (*in_RSI)(local_24 * 8 + local_28 * 4 + 3,in_RDX,in_RCX);
        (*in_RSI)(local_24 * 8 + local_28 * 4 + 1,in_RDX,in_RCX);
        break;
      case 0xb:
        (*in_RSI)(local_24 * 8 + local_28 * 4 + 3,in_RDX,in_RCX);
        (*in_RSI)(local_24 * 8 + local_28 * 4 + 1,in_RDX,in_RCX);
        (*in_RSI)(local_24 * 8 + local_28 * 4,in_RDX,in_RCX);
        break;
      case 0xc:
        (*in_RSI)(local_24 * 8 + local_28 * 4 + 3,in_RDX,in_RCX);
        (*in_RSI)(local_24 * 8 + local_28 * 4 + 2,in_RDX,in_RCX);
        break;
      case 0xd:
        (*in_RSI)(local_24 * 8 + local_28 * 4 + 3,in_RDX,in_RCX);
        (*in_RSI)(local_24 * 8 + local_28 * 4 + 2,in_RDX,in_RCX);
        (*in_RSI)(local_24 * 8 + local_28 * 4,in_RDX,in_RCX);
        break;
      case 0xe:
        (*in_RSI)(local_24 * 8 + local_28 * 4 + 3,in_RDX,in_RCX);
        (*in_RSI)(local_24 * 8 + local_28 * 4 + 2,in_RDX,in_RCX);
        (*in_RSI)(local_24 * 8 + local_28 * 4 + 1,in_RDX,in_RCX);
        break;
      case 0xf:
        (*in_RSI)(local_24 * 8 + local_28 * 4 + 3,in_RDX,in_RCX);
        (*in_RSI)(local_24 * 8 + local_28 * 4 + 2,in_RDX,in_RCX);
        (*in_RSI)(local_24 * 8 + local_28 * 4 + 1,in_RDX,in_RCX);
        (*in_RSI)(local_24 * 8 + local_28 * 4,in_RDX,in_RCX);
      }
    }
  }
  return;
}

Assistant:

void
foreach_bit(bit_vec v, bv_func func, void* p1, void* p2)
{
    int i;
    for (i = 0; i < v->len; i++) {
        int j;
        for (j = 0; j < 2; j++) {
            unsigned char nibble = (v->vec[i] >> (j * 4)) & 0xf;
            switch (nibble) {
            case 0xf:
                func(i * 8 + j * 4 + 3, p1, p2);
                func(i * 8 + j * 4 + 2, p1, p2);
                func(i * 8 + j * 4 + 1, p1, p2);
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0xe:
                func(i * 8 + j * 4 + 3, p1, p2);
                func(i * 8 + j * 4 + 2, p1, p2);
                func(i * 8 + j * 4 + 1, p1, p2);
                break;
            case 0xd:
                func(i * 8 + j * 4 + 3, p1, p2);
                func(i * 8 + j * 4 + 2, p1, p2);
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0xc:
                func(i * 8 + j * 4 + 3, p1, p2);
                func(i * 8 + j * 4 + 2, p1, p2);
                break;
            case 0xb:
                func(i * 8 + j * 4 + 3, p1, p2);
                func(i * 8 + j * 4 + 1, p1, p2);
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0xa:
                func(i * 8 + j * 4 + 3, p1, p2);
                func(i * 8 + j * 4 + 1, p1, p2);
                break;
            case 0x9:
                func(i * 8 + j * 4 + 3, p1, p2);
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0x8:
                func(i * 8 + j * 4 + 3, p1, p2);
                break;
            case 0x7:
                func(i * 8 + j * 4 + 2, p1, p2);
                func(i * 8 + j * 4 + 1, p1, p2);
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0x6:
                func(i * 8 + j * 4 + 2, p1, p2);
                func(i * 8 + j * 4 + 1, p1, p2);
                break;
            case 0x5:
                func(i * 8 + j * 4 + 2, p1, p2);
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0x4:
                func(i * 8 + j * 4 + 2, p1, p2);
                break;
            case 0x3:
                func(i * 8 + j * 4 + 1, p1, p2);
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0x2:
                func(i * 8 + j * 4 + 1, p1, p2);
                break;
            case 0x1:
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0x0:
                break;
            }
        }
    }
}